

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcMappedItem::IfcMappedItem(IfcMappedItem *this)

{
  IfcMappedItem *this_local;
  
  STEP::Object::Object
            ((Object *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x20,
             "IfcMappedItem");
  IfcRepresentationItem::IfcRepresentationItem
            ((IfcRepresentationItem *)this,&PTR_construction_vtable_24__00f8ad28);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>,
             &PTR_construction_vtable_24__00f8ad48);
  *(undefined8 *)this = 0xf8acc0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x20
       = 0xf8ad10;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0xf8ace8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x10,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).field_0x18,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcMappedItem() : Object("IfcMappedItem") {}